

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

void __thiscall GGSock::ClientData::ClientData(ClientData *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Communicator *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool local_3a;
  undefined1 local_39;
  Communicator *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  (this->info).port = 0;
  (this->info).address._M_dataplus._M_p = (pointer)&(this->info).address.field_2;
  *(undefined4 *)&(this->info).address.field_2 = 0x2e302e30;
  *(undefined4 *)((long)&(this->info).address.field_2 + 3) = 0x302e302e;
  (this->info).address._M_string_length = 7;
  (this->info).address.field_2._M_local_buf[7] = '\0';
  (this->info).dataTx_bytes = 0;
  (this->info).dataRx_bytes = 0;
  (this->info).currentFileId = -1;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->fileChunkRequests).
  super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  *(undefined8 *)&(this->info).currentProgress = 0;
  std::
  _Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ::_M_initialize_map(&(this->fileChunkRequests).
                       super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
                      ,0);
  (this->communicator).super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->communicator).super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3a = false;
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<GGSock::Communicator,std::allocator<GGSock::Communicator>,bool>
            (a_Stack_30,&local_38,(allocator<GGSock::Communicator> *)&local_39,&local_3a);
  _Var2._M_pi = a_Stack_30[0]._M_pi;
  pCVar1 = local_38;
  local_38 = (Communicator *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->communicator).
            super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->communicator).super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar1;
  (this->communicator).super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  return;
}

Assistant:

ClientData() {
        communicator = std::make_shared<Communicator>(false);
    }